

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isnan.c
# Opt level: O2

int signbit(double x)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  uint uVar2;
  undefined8 in_XMM0_Qb;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = x;
  uVar2 = movmskpd(in_EAX,auVar1);
  return uVar2 & 1;
}

Assistant:

int signbit(x)
double x;
{
union
	{
	double d;
	short s[4];
	int i[2];
	} u;

u.d = x;

if( sizeof(int) == 4 )
	{
#ifdef IBMPC
	return( u.i[1] < 0 );
#endif
#ifdef DEC
	return( u.s[3] < 0 );
#endif
#ifdef MIEEE
	return( u.i[0] < 0 );
#endif
	}
else
	{
#ifdef IBMPC
	return( u.s[3] < 0 );
#endif
#ifdef DEC
	return( u.s[3] < 0 );
#endif
#ifdef MIEEE
	return( u.s[0] < 0 );
#endif
	}
}